

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  byte *pbVar4;
  Message *pMVar5;
  uchar value;
  string local_58;
  char local_33 [3];
  ulong uStack_30;
  char ch;
  size_t i;
  Message m;
  bool is_attribute_local;
  string *str_local;
  
  m.ss_.ptr_._7_1_ = is_attribute;
  Message::Message((Message *)&i);
  for (uStack_30 = 0; uVar1 = uStack_30, uVar3 = std::__cxx11::string::size(), uVar1 < uVar3;
      uStack_30 = uStack_30 + 1) {
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)str);
    local_33[2] = *pbVar4;
    switch(local_33[2]) {
    case '\"':
      if ((m.ss_.ptr_._7_1_ & 1) == 0) {
        local_33[0] = '\"';
        Message::operator<<((Message *)&i,local_33);
      }
      else {
        Message::operator<<((Message *)&i,(char (*) [7])"&quot;");
      }
      break;
    default:
      bVar2 = IsValidXmlCharacter(local_33[2]);
      if (bVar2) {
        if (((m.ss_.ptr_._7_1_ & 1) == 0) || (bVar2 = IsNormalizableWhitespace(local_33[2]), !bVar2)
           ) {
          Message::operator<<((Message *)&i,local_33 + 2);
        }
        else {
          pMVar5 = Message::operator<<((Message *)&i,(char (*) [4])"&#x");
          String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)(byte)local_33[2],value);
          pMVar5 = Message::operator<<(pMVar5,&local_58);
          Message::operator<<(pMVar5,(char (*) [2])0x18af28);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
      break;
    case '&':
      Message::operator<<((Message *)&i,(char (*) [6])"&amp;");
      break;
    case '\'':
      if ((m.ss_.ptr_._7_1_ & 1) == 0) {
        local_33[1] = 0x27;
        Message::operator<<((Message *)&i,local_33 + 1);
      }
      else {
        Message::operator<<((Message *)&i,(char (*) [7])"&apos;");
      }
      break;
    case '<':
      Message::operator<<((Message *)&i,(char (*) [5])"&lt;");
      break;
    case '>':
      Message::operator<<((Message *)&i,(char (*) [5])"&gt;");
    }
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&i);
  Message::~Message((Message *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}